

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

void __thiscall
spectest::CommandRunner::PopulateImports(CommandRunner *this,Ptr *module,RefVec *imports)

{
  bool bVar1;
  Module *this_00;
  ModuleDesc *pMVar2;
  value_type local_60;
  undefined1 local_58 [8];
  Ptr extern_;
  ImportDesc *import;
  const_iterator __end1;
  const_iterator __begin1;
  vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> *__range1;
  RefVec *imports_local;
  Ptr *module_local;
  CommandRunner *this_local;
  
  this_00 = wabt::interp::RefPtr<wabt::interp::Module>::operator->(module);
  pMVar2 = wabt::interp::Module::desc(this_00);
  __end1 = std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::begin
                     (&pMVar2->imports);
  import = (ImportDesc *)
           std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::end
                     (&pMVar2->imports);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_wabt::interp::ImportDesc_*,_std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>_>
                                *)&import);
    if (!bVar1) break;
    extern_.root_index_ =
         (Index)__gnu_cxx::
                __normal_iterator<const_wabt::interp::ImportDesc_*,_std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>_>
                ::operator*(&__end1);
    GetImport((Ptr *)local_58,this,(string *)extern_.root_index_,
              (string *)(extern_.root_index_ + 0x20));
    bVar1 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)local_58);
    if (bVar1) {
      local_60.index =
           (size_t)wabt::interp::RefPtr<wabt::interp::Extern>::ref
                             ((RefPtr<wabt::interp::Extern> *)local_58);
    }
    else {
      local_60.index = wabt::interp::Ref::Null;
    }
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back(imports,&local_60)
    ;
    wabt::interp::RefPtr<wabt::interp::Extern>::~RefPtr((RefPtr<wabt::interp::Extern> *)local_58);
    __gnu_cxx::
    __normal_iterator<const_wabt::interp::ImportDesc_*,_std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void CommandRunner::PopulateImports(const interp::Module::Ptr& module,
                                    RefVec* imports) {
  for (auto&& import : module->desc().imports) {
    auto extern_ = GetImport(import.type.module, import.type.name);
    imports->push_back(extern_ ? extern_.ref() : Ref::Null);
  }
}